

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall
t_markdown_generator::print_const_value
          (t_markdown_generator *this,t_type *type,t_const_value *tvalue)

{
  size_t *__return_storage_ptr__;
  __type _Var1;
  bool bVar2;
  t_const_value_type tVar3;
  uint uVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  int64_t iVar8;
  undefined4 extraout_var;
  reference pptVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  pointer ppVar10;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar11;
  pointer ppVar12;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *pvVar13;
  t_type *ptVar14;
  reference pptVar15;
  char *pcVar16;
  double dVar17;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_408;
  t_const_value **local_400;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3f8;
  iterator list_iter_1;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list_elems_1;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3d0;
  t_const_value **local_3c8;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3c0;
  iterator list_iter;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list_elems;
  _Self local_398;
  _Base_ptr local_390;
  _Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_388;
  iterator map_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  map_elems;
  string local_330;
  undefined1 local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_288
  ;
  t_field **local_280;
  t_type *local_278;
  t_type *field_type;
  _Base_ptr local_268;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_260;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  t_base local_1a0;
  byte local_199;
  t_base tbase;
  bool first;
  t_type *truetype;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string name;
  string local_60;
  undefined1 local_40 [8];
  string fname;
  t_const_value *tvalue_local;
  t_type *type_local;
  t_markdown_generator *this_local;
  
  fname.field_2._8_8_ = tvalue;
  tVar3 = t_const_value::get_type(tvalue);
  _tbase = (t_struct *)type;
  if (tVar3 == CV_IDENTIFIER) {
    psVar6 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar6);
    make_file_name((string *)local_40,this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    t_const_value::get_identifier_abi_cxx11_(&local_b0,(t_const_value *)fname.field_2._8_8_);
    escape_html((string *)local_90,this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar7 = std::operator<<((ostream *)&this->f_out_,"[```");
    poVar7 = std::operator<<(poVar7,(string *)local_90);
    std::__cxx11::string::string((string *)&local_170,(string *)local_40);
    make_file_link(&local_150,this,&local_170);
    std::operator+(&local_130,"```](",&local_150);
    std::operator+(&local_110,&local_130,"#constant-");
    str_to_id((string *)&truetype,this,(string *)local_90);
    std::operator+(&local_f0,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&truetype);
    std::operator+(&local_d0,&local_f0,")");
    std::operator<<(poVar7,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&truetype);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    while (uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[9])(), (uVar4 & 1) != 0) {
      _tbase = (t_struct *)t_typedef::get_type((t_typedef *)_tbase);
    }
    local_199 = 1;
    uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar4 & 1) == 0) {
      uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[0xb])();
        if (((uVar4 & 1) == 0) &&
           (uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar4 & 1) == 0)) {
          uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[0x10])();
          if ((uVar4 & 1) == 0) {
            uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[0xe])();
            if ((uVar4 & 1) == 0) {
              uVar4 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[0xf])();
              if ((uVar4 & 1) == 0) {
                std::operator<<((ostream *)&this->f_out_,"UNKNOWN TYPE");
              }
              else {
                std::operator<<((ostream *)&this->f_out_,"{ ");
                pvVar13 = t_const_value::get_list((t_const_value *)fname.field_2._8_8_);
                std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                          ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&list_iter_1
                           ,pvVar13);
                __gnu_cxx::
                __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                ::__normal_iterator(&local_3f8);
                local_400 = (t_const_value **)
                            std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                                      ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                                       &list_iter_1);
                local_3f8._M_current = local_400;
                while( true ) {
                  local_408._M_current =
                       (t_const_value **)
                       std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                                 ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                                  &list_iter_1);
                  bVar2 = __gnu_cxx::operator!=(&local_3f8,&local_408);
                  if (!bVar2) break;
                  if ((local_199 & 1) == 0) {
                    std::operator<<((ostream *)&this->f_out_,", ");
                  }
                  local_199 = 0;
                  ptVar14 = t_set::get_elem_type((t_set *)_tbase);
                  pptVar15 = __gnu_cxx::
                             __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                             ::operator*(&local_3f8);
                  print_const_value(this,ptVar14,*pptVar15);
                  __gnu_cxx::
                  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                  ::operator++(&local_3f8,0);
                }
                std::operator<<((ostream *)&this->f_out_," }");
                std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::~vector
                          ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&list_iter_1
                          );
              }
            }
            else {
              std::operator<<((ostream *)&this->f_out_,"{ ");
              pvVar13 = t_const_value::get_list((t_const_value *)fname.field_2._8_8_);
              std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                        ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&list_iter,
                         pvVar13);
              __gnu_cxx::
              __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::__normal_iterator(&local_3c0);
              local_3c8 = (t_const_value **)
                          std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                                    ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                                     &list_iter);
              local_3c0._M_current = local_3c8;
              while( true ) {
                local_3d0._M_current =
                     (t_const_value **)
                     std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                               ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                                &list_iter);
                bVar2 = __gnu_cxx::operator!=(&local_3c0,&local_3d0);
                if (!bVar2) break;
                if ((local_199 & 1) == 0) {
                  std::operator<<((ostream *)&this->f_out_,", ");
                }
                local_199 = 0;
                ptVar14 = t_list::get_elem_type((t_list *)_tbase);
                pptVar15 = __gnu_cxx::
                           __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                           ::operator*(&local_3c0);
                print_const_value(this,ptVar14,*pptVar15);
                __gnu_cxx::
                __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                ::operator++(&local_3c0,0);
              }
              std::operator<<((ostream *)&this->f_out_," }");
              std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::~vector
                        ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&list_iter);
            }
          }
          else {
            std::operator<<((ostream *)&this->f_out_,"{ ");
            pmVar11 = t_const_value::get_map((t_const_value *)fname.field_2._8_8_);
            std::
            map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
            ::map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   *)&map_iter,pmVar11);
            std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            _Rb_tree_iterator(&local_388);
            local_390 = (_Base_ptr)
                        std::
                        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        ::begin((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                                 *)&map_iter);
            local_388._M_node = local_390;
            while( true ) {
              local_398._M_node =
                   (_Base_ptr)
                   std::
                   map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                          *)&map_iter);
              bVar2 = std::operator!=(&local_388,&local_398);
              if (!bVar2) break;
              if ((local_199 & 1) == 0) {
                std::operator<<((ostream *)&this->f_out_,", ");
              }
              local_199 = 0;
              ptVar14 = t_map::get_key_type((t_map *)_tbase);
              ppVar12 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_388);
              print_const_value(this,ptVar14,ppVar12->first);
              std::operator<<((ostream *)&this->f_out_," = ");
              ptVar14 = t_map::get_val_type((t_map *)_tbase);
              ppVar12 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_388);
              print_const_value(this,ptVar14,ppVar12->second);
              std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator++
                        (&local_388,0);
            }
            std::operator<<((ostream *)&this->f_out_," }");
            std::
            map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
            ::~map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    *)&map_iter);
          }
        }
        else {
          std::operator<<((ostream *)&this->f_out_,"{ ");
          f_iter._M_current = (t_field **)t_struct::get_members(_tbase);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&val);
          v_iter._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)fname.field_2._8_8_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_260);
          local_268 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin(v_iter._M_node);
          local_260._M_node = local_268;
          while( true ) {
            field_type = (t_type *)
                         std::
                         map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                         ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                                *)v_iter._M_node);
            bVar2 = std::operator!=(&local_260,(_Self *)&field_type);
            if (!bVar2) break;
            local_278 = (t_type *)0x0;
            local_280 = (t_field **)
                        std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current)
            ;
            val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   *)local_280;
            while( true ) {
              local_288._M_current =
                   (t_field **)
                   std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)&val,&local_288);
              if (!bVar2) break;
              pptVar9 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              psVar6 = t_field::get_name_abi_cxx11_(*pptVar9);
              ppVar10 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_260);
              t_const_value::get_string_abi_cxx11_(&local_2a8,ppVar10->first);
              _Var1 = std::operator==(psVar6,&local_2a8);
              std::__cxx11::string::~string((string *)&local_2a8);
              if (_Var1) {
                pptVar9 = __gnu_cxx::
                          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                       *)&val);
                local_278 = t_field::get_type(*pptVar9);
              }
              __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&val);
            }
            if (local_278 == (t_type *)0x0) {
              local_309 = 1;
              __return_storage_ptr___00 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar5 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[3])();
              std::operator+(&local_2e8,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar5));
              std::operator+(&local_2c8,&local_2e8," has no field ");
              ppVar10 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_260);
              t_const_value::get_string_abi_cxx11_(&local_308,ppVar10->first);
              std::operator+(__return_storage_ptr___00,&local_2c8,&local_308);
              local_309 = 0;
              __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
            if ((local_199 & 1) == 0) {
              std::operator<<((ostream *)&this->f_out_,", ");
            }
            local_199 = 0;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_260);
            __return_storage_ptr__ = &map_elems._M_t._M_impl.super__Rb_tree_header._M_node_count;
            t_const_value::get_string_abi_cxx11_((string *)__return_storage_ptr__,ppVar10->first);
            escape_html(&local_330,this,(string *)__return_storage_ptr__);
            poVar7 = std::operator<<((ostream *)&this->f_out_,(string *)&local_330);
            std::operator<<(poVar7," = ");
            std::__cxx11::string::~string((string *)&local_330);
            std::__cxx11::string::~string
                      ((string *)&map_elems._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ptVar14 = local_278;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_260);
            print_const_value(this,ptVar14,ppVar10->second);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_260);
          }
          std::operator<<((ostream *)&this->f_out_," }");
        }
      }
      else {
        iVar5 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[3])();
        escape_html(&local_200,this,(string *)CONCAT44(extraout_var,iVar5));
        poVar7 = std::operator<<((ostream *)&this->f_out_,(string *)&local_200);
        poVar7 = std::operator<<(poVar7,".");
        t_const_value::get_identifier_name_abi_cxx11_
                  ((string *)&fields,(t_const_value *)fname.field_2._8_8_);
        escape_html(&local_220,this,(string *)&fields);
        std::operator<<(poVar7,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&fields);
        std::__cxx11::string::~string((string *)&local_200);
      }
    }
    else {
      local_1a0 = t_base_type::get_base((t_base_type *)_tbase);
      std::operator<<((ostream *)&this->f_out_,"```");
      switch(local_1a0) {
      case TYPE_STRING:
        t_generator::get_escaped_string_abi_cxx11_
                  (&local_1e0,&this->super_t_generator,(t_const_value *)fname.field_2._8_8_);
        escape_html(&local_1c0,this,&local_1e0);
        std::operator<<((ostream *)&this->f_out_,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        break;
      case TYPE_BOOL:
        iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
        pcVar16 = "false";
        if (iVar8 != 0) {
          pcVar16 = "true";
        }
        std::operator<<((ostream *)&this->f_out_,pcVar16);
        break;
      case TYPE_I8:
        iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
        std::ostream::operator<<(&this->f_out_,iVar8);
        break;
      case TYPE_I16:
        iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
        std::ostream::operator<<(&this->f_out_,iVar8);
        break;
      case TYPE_I32:
        iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
        std::ostream::operator<<(&this->f_out_,iVar8);
        break;
      case TYPE_I64:
        iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
        std::ostream::operator<<(&this->f_out_,iVar8);
        break;
      case TYPE_DOUBLE:
        tVar3 = t_const_value::get_type((t_const_value *)fname.field_2._8_8_);
        if (tVar3 == CV_INTEGER) {
          iVar8 = t_const_value::get_integer((t_const_value *)fname.field_2._8_8_);
          std::ostream::operator<<(&this->f_out_,iVar8);
        }
        else {
          dVar17 = t_const_value::get_double((t_const_value *)fname.field_2._8_8_);
          std::ostream::operator<<(&this->f_out_,dVar17);
        }
        break;
      default:
        std::operator<<((ostream *)&this->f_out_,"UNKNOWN BASE TYPE");
      }
      std::operator<<((ostream *)&this->f_out_,"```");
    }
  }
  return;
}

Assistant:

void t_markdown_generator::print_const_value(t_type* type, t_const_value* tvalue) {

  // if tvalue is an identifier, the constant content is already shown elsewhere
  if (tvalue->get_type() == t_const_value::CV_IDENTIFIER) {
    string fname = make_file_name(program_->get_name());
    string name = escape_html(tvalue->get_identifier());
    f_out_ << "[```" << name << "```](" 
      + make_file_link(fname) 
      + "#constant-" + str_to_id(name) + ")";
    return;
  }

  t_type* truetype = type;
  while (truetype->is_typedef()) {
    truetype = ((t_typedef*)truetype)->get_type();
  }

  bool first = true;
  if (truetype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)truetype)->get_base();
    f_out_ << "```";
    switch (tbase) {
    case t_base_type::TYPE_STRING: 
      f_out_ << escape_html(get_escaped_string(tvalue));
      break;
    case t_base_type::TYPE_BOOL:
      f_out_ << ((tvalue->get_integer() != 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I16:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I32:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I64:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (tvalue->get_type() == t_const_value::CV_INTEGER) {
        f_out_ << tvalue->get_integer();
      } else {
        f_out_ << tvalue->get_double();
      }
      break;
    default:
      f_out_ << "UNKNOWN BASE TYPE";
      break;
    }
    f_out_ << "```";
  } else if (truetype->is_enum()) {
    f_out_ << escape_html(truetype->get_name()) << "."
           << escape_html(tvalue->get_identifier_name());
  } else if (truetype->is_struct() || truetype->is_xception()) {
    f_out_ << "{ ";
    const vector<t_field*>& fields = ((t_struct*)truetype)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + truetype->get_name() + " has no field "
            + v_iter->first->get_string();
      }
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      f_out_ << escape_html(v_iter->first->get_string()) << " = ";
      print_const_value(field_type, v_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_map()) {
    f_out_ << "{ ";
    map<t_const_value*, t_const_value*, t_const_value::value_compare> map_elems = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator map_iter;
    for (map_iter = map_elems.begin(); map_iter != map_elems.end(); map_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_map*)truetype)->get_key_type(), map_iter->first);
      f_out_ << " = ";
      print_const_value(((t_map*)truetype)->get_val_type(), map_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_list()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_list*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else if (truetype->is_set()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_set*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else {
    f_out_ << "UNKNOWN TYPE";
  }
}